

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_str_repeat(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  int local_38;
  int rc;
  int nMul;
  int nLen;
  char *zIn;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zIn = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if (nArg < 2) {
    jx9_result_null(pCtx);
  }
  else {
    _nMul = jx9_value_to_string(*apArg,&rc);
    if (rc < 1) {
      jx9_result_null(pjStack_18);
    }
    else {
      local_38 = jx9_value_to_int(*(jx9_value **)(zIn + 8));
      if (local_38 < 1) {
        jx9_result_string(pjStack_18,"",0);
      }
      else {
        while ((0 < local_38 && (iVar1 = jx9_result_string(pjStack_18,_nMul,rc), iVar1 == 0))) {
          local_38 = local_38 + -1;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_str_repeat(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn;
	int nLen, nMul;
	int rc;
	if( nArg < 2 ){
		/* Missing arguments, return NULL */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the target string */
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 ){
		/* Empty string.Return null */
		jx9_result_null(pCtx);
		return JX9_OK;
	}
	/* Extract the multiplier */
	nMul = jx9_value_to_int(apArg[1]);
	if( nMul < 1 ){
		/* Return the empty string */
		jx9_result_string(pCtx, "", 0);
		return JX9_OK;
	}
	/* Perform the requested operation */
	for(;;){
		if( nMul < 1 ){
			break;
		}
		/* Append the copy */
		rc = jx9_result_string(pCtx, zIn, nLen);
		if( rc != JX9_OK ){
			/* Out of memory, break immediately */
			break;
		}
		nMul--;
	}
	return JX9_OK;
}